

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O2

void Imf_3_4::RgbaYca::RGBAtoYCA(V3f *yw,int n,bool aIsValid,Rgba *rgbaIn,Rgba *ycaOut)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  ulong uVar4;
  half *phVar5;
  ulong uVar6;
  half *this;
  float fVar7;
  float fVar8;
  Rgba in;
  undefined8 local_60;
  float local_54;
  V3f *local_50;
  ulong local_48;
  double local_40;
  Rgba *local_38;
  
  uVar4 = 0;
  uVar6 = (ulong)(uint)n;
  if (n < 1) {
    uVar6 = uVar4;
  }
  uVar6 = uVar6 << 3;
  local_50 = yw;
  local_48 = uVar6;
  local_38 = rgbaIn;
  for (; uVar6 != uVar4; uVar4 = uVar4 + 8) {
    local_60 = *(ulong *)((long)&(local_38->r)._h + uVar4);
    if (((~(uint)local_60 & 0x7c00) == 0) ||
       (pfVar1 = (float *)(_imath_half_to_float_table + (local_60 & 0xffff) * 4),
       *pfVar1 <= 0.0 && *pfVar1 != 0.0)) {
      Imath_3_2::half::operator=((half *)&local_60,0.0);
      uVar3 = (uint)local_60._2_2_;
    }
    else {
      uVar3 = (uint)local_60 >> 0x10;
    }
    if (((~uVar3 & 0x7c00) == 0) ||
       (pfVar1 = (float *)(_imath_half_to_float_table + (ulong)uVar3 * 4),
       *pfVar1 <= 0.0 && *pfVar1 != 0.0)) {
      Imath_3_2::half::operator=((half *)((long)&local_60 + 2),0.0);
    }
    if (((~local_60._4_4_ & 0x7c00) == 0) ||
       (pfVar1 = (float *)(_imath_half_to_float_table + (ulong)(local_60._4_4_ & 0xffff) * 4),
       uVar3 = local_60._4_4_, *pfVar1 <= 0.0 && *pfVar1 != 0.0)) {
      Imath_3_2::half::operator=((half *)((long)&local_60 + 4),0.0);
      uVar3 = (uint)local_60._4_2_;
    }
    phVar5 = (half *)((long)&(ycaOut->r)._h + uVar4);
    fVar7 = *(float *)(_imath_half_to_float_table + (local_60 & 0xffff) * 4);
    fVar8 = *(float *)(_imath_half_to_float_table + (local_60 >> 0x10 & 0xffff) * 4);
    fVar2 = *(float *)(_imath_half_to_float_table + (ulong)(uVar3 & 0xffff) * 4);
    if (((fVar7 != fVar8) || (fVar8 != fVar2)) || (NAN(fVar8) || NAN(fVar2))) {
      this = (half *)((long)&(ycaOut->g)._h + uVar4);
      Imath_3_2::half::operator=
                (this,fVar2 * local_50->z + fVar7 * local_50->x + fVar8 * local_50->y);
      local_54 = *(float *)(_imath_half_to_float_table + (ulong)this->_h * 4);
      fVar7 = *(float *)(_imath_half_to_float_table + (local_60 & 0xffff) * 4) - local_54;
      local_40 = (double)local_54 * 65504.0;
      if ((double)ABS(fVar7) < local_40) {
        fVar7 = fVar7 / local_54;
      }
      else {
        fVar7 = 0.0;
      }
      Imath_3_2::half::operator=(phVar5,fVar7);
      fVar8 = *(float *)(_imath_half_to_float_table + (local_60 >> 0x20 & 0xffff) * 4) - local_54;
      fVar7 = 0.0;
      uVar6 = local_48;
      if ((double)ABS(fVar8) < local_40) {
        fVar7 = fVar8 / local_54;
      }
    }
    else {
      Imath_3_2::half::operator=(phVar5,0.0);
      fVar7 = 0.0;
      *(ushort *)((long)&(ycaOut->g)._h + uVar4) = local_60._2_2_;
    }
    Imath_3_2::half::operator=((half *)((long)&(ycaOut->b)._h + uVar4),fVar7);
    phVar5 = (half *)((long)&(ycaOut->a)._h + uVar4);
    if (aIsValid) {
      phVar5->_h = local_60._6_2_;
    }
    else {
      Imath_3_2::half::operator=(phVar5,1.0);
    }
  }
  return;
}

Assistant:

void
RGBAtoYCA (
    const V3f& yw,
    int        n,
    bool       aIsValid,
    const Rgba rgbaIn[/*n*/],
    Rgba       ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        Rgba  in  = rgbaIn[i];
        Rgba& out = ycaOut[i];

        //
        // Conversion to YCA and subsequent chroma subsampling
        // work only if R, G and B are finite and non-negative.
        //

        if (!in.r.isFinite () || in.r < 0) in.r = 0;

        if (!in.g.isFinite () || in.g < 0) in.g = 0;

        if (!in.b.isFinite () || in.b < 0) in.b = 0;

        if (in.r == in.g && in.g == in.b)
        {
            //
            // Special case -- R, G and B are equal. To avoid rounding
            // errors, we explicitly set the output luminance channel
            // to G, and the chroma channels to 0.
            //
            // The special cases here and in YCAtoRGBA() ensure that
            // converting black-and white images from RGBA to YCA and
            // back is lossless.
            //

            out.r = 0;
            out.g = in.g;
            out.b = 0;
        }
        else
        {
            out.g = in.r * yw.x + in.g * yw.y + in.b * yw.z;

            float Y = out.g;

            if (abs (in.r - Y) < HALF_MAX * Y)
                out.r = (in.r - Y) / Y;
            else
                out.r = 0;

            if (abs (in.b - Y) < HALF_MAX * Y)
                out.b = (in.b - Y) / Y;
            else
                out.b = 0;
        }

        if (aIsValid)
            out.a = in.a;
        else
            out.a = 1;
    }
}